

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O2

void __thiscall QueryCompiler::QueryCompiler(QueryCompiler *this,shared_ptr<TreeDecomposition> *td)

{
  std::__shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2> *)this,
             &td->super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>);
  (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_queryList).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_queryList).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_queryList).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_cache)._M_h._M_buckets = &(this->_cache)._M_h._M_single_bucket;
  (this->_cache)._M_h._M_bucket_count = 1;
  (this->_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_cache)._M_h._M_element_count = 0;
  (this->_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->_viewCache)._M_h._M_buckets = &(this->_viewCache)._M_h._M_single_bucket;
  (this->_viewCache)._M_h._M_bucket_count = 1;
  (this->_viewCache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_viewCache)._M_h._M_element_count = 0;
  (this->_viewCache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_viewCache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_viewCache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

QueryCompiler::QueryCompiler(shared_ptr<TreeDecomposition> td) : _td(td)
{
}